

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O1

void __thiscall
lcp<dna_bwt_n<dna_string_n>,_unsigned_long>::lcp
          (lcp<dna_bwt_n<dna_string_n>,_unsigned_long> *this,dna_bwt_n<dna_string_n> *bwt)

{
  undefined8 *puVar1;
  size_type __n;
  pointer puVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  value_type *__val;
  ulong uVar18;
  ostream *poVar19;
  _Elt_pointer psVar20;
  int iVar21;
  sa_leaf *__args;
  sa_node_n *psVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int t;
  uint64_t lcp_values;
  sa_leaf L;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> S;
  vector<sa_leaf,_std::allocator<sa_leaf>_> TMP_LEAVES;
  sa_leaf root;
  int local_14c;
  lcp<dna_bwt_n<dna_string_n>,_unsigned_long> *local_148;
  uint64_t local_140;
  sa_leaf local_138;
  _Deque_base<sa_node_n,_std::allocator<sa_node_n>_> local_118;
  dna_bwt_n<dna_string_n> *local_c8;
  long local_c0;
  sa_node_n local_b8;
  sa_node_n local_78;
  
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = 0;
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->bwt = (dna_bwt_n<dna_string_n> *)0x0;
  this->nil = 0xffffffffffffffff;
  __n = bwt->n;
  this->n = __n;
  local_148 = this;
  local_c8 = bwt;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,__n,&this->nil,
             (allocator_type *)&local_b8);
  puVar2 = (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_118._M_impl.super__Deque_impl_data._M_map;
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_118._M_impl.super__Deque_impl_data._M_map_size;
  (this->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->first_TERM;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if (local_118._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_118._M_impl.super__Deque_impl_data._M_map);
  }
  *(local_148->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values.",0x4f
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_140 = 1;
  local_b8.first_TERM = 0;
  local_b8.first_A = 0;
  local_b8.first_C = 0;
  local_b8.first_TERM = (uint64_t)operator_new(0x78);
  local_b8.first_A = local_b8.first_TERM + 0x78;
  *(undefined8 *)(local_b8.first_TERM + 0x60) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x68) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x50) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x58) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x40) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x48) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x30) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x38) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x20) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x28) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x10) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x18) = 0;
  *(undefined8 *)local_b8.first_TERM = 0;
  *(undefined8 *)(local_b8.first_TERM + 8) = 0;
  *(undefined8 *)(local_b8.first_TERM + 0x70) = 0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8.first_C = local_b8.first_A;
  std::_Deque_base<sa_leaf,_std::allocator<sa_leaf>_>::_M_initialize_map
            ((_Deque_base<sa_leaf,_std::allocator<sa_leaf>_> *)&local_118,0);
  local_78.first_TERM = 0;
  local_78.first_A = local_c8->F_A;
  local_78.first_C = 0;
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (_Elt_pointer)&local_118._M_impl.super__Deque_impl_data._M_finish._M_last[-1].first_T) {
    std::deque<sa_leaf,std::allocator<sa_leaf>>::_M_push_back_aux<sa_leaf_const&>
              ((deque<sa_leaf,std::allocator<sa_leaf>> *)&local_118,(sa_leaf *)&local_78);
  }
  else {
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_C = 0;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_TERM = 0;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_A = local_78.first_A;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)&(local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_G;
  }
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_c0 = 0;
  }
  else {
    iVar21 = -1;
    uVar23 = 0;
    local_c0 = 0;
    do {
      if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar22 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_138.rn.first = psVar22[7].first_N;
        local_138.rn.second = psVar22[7].first_T;
        local_138.depth = psVar22[7].last;
        operator_delete(local_118._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_118._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_118._M_impl.super__Deque_impl_data._M_finish._M_last =
             (_Elt_pointer)&local_118._M_impl.super__Deque_impl_data._M_finish._M_first[7].depth;
        psVar20 = (_Elt_pointer)
                  &local_118._M_impl.super__Deque_impl_data._M_finish._M_first[7].first_N;
        local_118._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        psVar20 = (_Elt_pointer)
                  &local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_T;
        local_138.depth = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].depth;
        local_138.rn.first = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_T;
        local_138.rn.second = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last;
      }
      uVar18 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
               -0x5555555555555555 +
               ((long)psVar20 - (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >>
               3) * -0x5555555555555555 +
               (((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node -
                 (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
               (ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node ==
                      (_Map_pointer)0x0)) * 0x15;
      if (uVar23 < uVar18) {
        uVar23 = uVar18;
      }
      uVar18 = local_138.rn.first + 1;
      if (uVar18 < local_138.rn.second) {
        puVar2 = (local_148->LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          puVar2[uVar18] = local_138.depth;
          local_140 = local_140 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_138.rn.second);
      }
      local_14c = 0;
      local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = psVar20;
      dna_bwt_n<dna_string_n>::next_leaves
                (local_c8,&local_138,(vector<sa_leaf,_std::allocator<sa_leaf>_> *)&local_b8,
                 &local_14c,2);
      lVar25 = (long)local_14c;
      if (0 < lVar25) {
        lVar26 = lVar25 + 1;
        lVar25 = lVar25 * 0x18;
        do {
          __args = (sa_leaf *)(local_b8.first_TERM + lVar25 + -0x18);
          if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (_Elt_pointer)&local_118._M_impl.super__Deque_impl_data._M_finish._M_last[-1].first_T)
          {
            std::deque<sa_leaf,std::allocator<sa_leaf>>::_M_push_back_aux<sa_leaf_const&>
                      ((deque<sa_leaf,std::allocator<sa_leaf>> *)&local_118,__args);
          }
          else {
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_C = __args->depth;
            uVar3 = (__args->rn).second;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_TERM =
                 (__args->rn).first;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_A = uVar3;
            local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 (_Elt_pointer)&(local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_G
            ;
          }
          lVar26 = lVar26 + -1;
          lVar25 = lVar25 + -0x18;
        } while (1 < lVar26);
      }
      iVar24 = (int)((local_140 * 100) / local_148->n);
      if (iVar21 < iVar24) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LCP: ",5);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"%.",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        iVar21 = iVar24;
      }
      local_c0 = local_c0 + 1;
    } while (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<sa_leaf,_std::allocator<sa_leaf>_>::~_Deque_base
            ((_Deque_base<sa_leaf,_std::allocator<sa_leaf>_> *)&local_118);
  if ((undefined8 *)local_b8.first_TERM != (undefined8 *)0x0) {
    operator_delete((void *)local_b8.first_TERM);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Visited leaves cover ",0x15);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"/",1);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," input characters.",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computed ",9);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"/",1);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," LCP values.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Max stack size = ",0x11)
  ;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Processed ",10);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar19," suffix-tree leaves of size >= 2.",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nNow navigating suffix tree nodes to compute remaining LCP values.",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_138.rn.first = 0;
  local_138.rn.second = 0;
  local_138.depth = 0;
  local_138.rn.first = (unsigned_long)operator_new(0x140);
  local_138.rn.second = local_138.rn.first + 0x140;
  *(undefined8 *)(local_138.rn.first + 0x30) = 0;
  *(undefined8 *)(local_138.rn.first + 0x38) = 0;
  *(undefined8 *)(local_138.rn.first + 0x20) = 0;
  *(undefined8 *)(local_138.rn.first + 0x28) = 0;
  *(undefined8 *)(local_138.rn.first + 0x10) = 0;
  *(undefined8 *)(local_138.rn.first + 0x18) = 0;
  *(undefined8 *)local_138.rn.first = 0;
  *(undefined8 *)(local_138.rn.first + 8) = 0;
  lVar25 = 0x40;
  do {
    uVar4 = *(undefined8 *)local_138.rn.first;
    uVar5 = *(undefined8 *)(local_138.rn.first + 8);
    uVar6 = *(undefined8 *)(local_138.rn.first + 0x10);
    uVar7 = *(undefined8 *)(local_138.rn.first + 0x18);
    uVar8 = *(undefined8 *)(local_138.rn.first + 0x20);
    uVar9 = *(undefined8 *)(local_138.rn.first + 0x28);
    uVar10 = *(undefined8 *)(local_138.rn.first + 0x38);
    puVar1 = (undefined8 *)(local_138.rn.first + lVar25 + 0x30);
    *puVar1 = *(undefined8 *)(local_138.rn.first + 0x30);
    puVar1[1] = uVar10;
    puVar1 = (undefined8 *)(local_138.rn.first + lVar25 + 0x20);
    *puVar1 = uVar8;
    puVar1[1] = uVar9;
    puVar1 = (undefined8 *)(local_138.rn.first + lVar25 + 0x10);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    *(undefined8 *)(local_138.rn.first + lVar25) = uVar4;
    ((undefined8 *)(local_138.rn.first + lVar25))[1] = uVar5;
    lVar25 = lVar25 + 0x40;
  } while (lVar25 != 0x140);
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_138.depth = local_138.rn.second;
  std::_Deque_base<sa_node_n,_std::allocator<sa_node_n>_>::_M_initialize_map(&local_118,0);
  local_b8.first_TERM = 0;
  local_b8.first_A = local_c8->F_A;
  local_b8.first_C = local_c8->F_C;
  local_b8.first_G = local_c8->F_G;
  local_b8.first_N = local_c8->F_N;
  local_b8.first_T = local_c8->F_T;
  local_b8.last = local_c8->n;
  local_b8.depth = 0;
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<sa_node_n,std::allocator<sa_node_n>>::_M_push_back_aux<sa_node_n_const&>
              ((deque<sa_node_n,std::allocator<sa_node_n>> *)&local_118,&local_b8);
  }
  else {
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->last = local_b8.last;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->depth = 0;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_N = local_b8.first_N;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_T = local_b8.first_T;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_C = local_b8.first_C;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_G = local_b8.first_G;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_TERM = 0;
    (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_A = local_b8.first_A;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar21 = -1;
    uVar23 = 0;
    do {
      uVar18 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
               ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
               ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node +
                ((ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node !=
                        (_Map_pointer)0x0) * -8 -
                (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node) &
               0xfffffffffffffff8);
      if (uVar18 <= uVar23) {
        uVar18 = uVar23;
      }
      if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar22 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_78.first_TERM = psVar22[7].first_TERM;
        local_78.first_A = psVar22[7].first_A;
        local_78.first_C = psVar22[7].first_C;
        local_78.first_G = psVar22[7].first_G;
        local_78.first_N = psVar22[7].first_N;
        local_78.first_T = psVar22[7].first_T;
        local_78.last = psVar22[7].last;
        local_78.depth = psVar22[7].depth;
        operator_delete(local_118._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_118._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_118._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_first + 8;
        psVar20 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first + 7;
        local_118._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        psVar20 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        local_78.first_TERM =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_TERM;
        local_78.first_A = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_A;
        local_78.first_C = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_C;
        local_78.first_G = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_G;
        local_78.first_N = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_N;
        local_78.first_T = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first_T;
        local_78.last = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last;
        local_78.depth = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].depth;
      }
      local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = psVar20;
      update_lcp<unsigned_long>(&local_78,&local_148->LCP,&local_140);
      local_14c = 0;
      dna_bwt_n<dna_string_n>::next_nodes
                (local_c8,&local_78,(vector<sa_node_n,_std::allocator<sa_node_n>_> *)&local_138,
                 &local_14c);
      lVar25 = (long)local_14c;
      if (0 < lVar25) {
        lVar26 = lVar25 + 1;
        lVar25 = lVar25 << 6;
        do {
          psVar22 = (sa_node_n *)(local_138.rn.first + lVar25 + -0x40);
          if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<sa_node_n,std::allocator<sa_node_n>>::_M_push_back_aux<sa_node_n_const&>
                      ((deque<sa_node_n,std::allocator<sa_node_n>> *)&local_118,psVar22);
          }
          else {
            uVar11 = psVar22->first_TERM;
            uVar12 = psVar22->first_A;
            uVar13 = psVar22->first_C;
            uVar14 = psVar22->first_G;
            uVar15 = psVar22->first_N;
            uVar16 = psVar22->first_T;
            uVar17 = psVar22->depth;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->last = psVar22->last;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->depth = uVar17;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_N = uVar15;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_T = uVar16;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_C = uVar13;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_G = uVar14;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_TERM = uVar11;
            (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur)->first_A = uVar12;
            local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          lVar26 = lVar26 + -1;
          lVar25 = lVar25 + -0x40;
        } while (1 < lVar26);
      }
      iVar24 = (int)((local_140 * 100) / local_148->n);
      if (iVar21 < iVar24) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LCP: ",5);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"%.",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        iVar21 = iVar24;
      }
      uVar23 = uVar18;
    } while (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computed ",9);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"/",1);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," LCP values.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Max stack size = ",0x11)
  ;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Processed ",10);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," suffix-tree nodes.",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::_Deque_base<sa_node_n,_std::allocator<sa_node_n>_>::~_Deque_base(&local_118);
  if ((undefined8 *)local_138.rn.first != (undefined8 *)0x0) {
    operator_delete((void *)local_138.rn.first);
  }
  return;
}

Assistant:

lcp(bwt_t * bwt){

		this->bwt;

		n = bwt->size();

		LCP = vector<lcp_int_t>(n, nil);
		LCP[0] = 0;

		/*
		 * FIRST PASS: LEAVES NAVIGATION. COMPUTE LCP VALUES INSIDE SUFFIX TREE LEAVES.
		 */

		cout << "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values." << endl;

		uint64_t m = 0;//portion of text covered by visited leaves
		uint64_t leaves = 0;//number of visited leaves
		uint64_t max_stack = 0;
		uint64_t lcp_values = 1;//number of filled LCP values

		{

			auto TMP_LEAVES = vector<sa_leaf>(5);

			stack<sa_leaf> S;

			sa_leaf root = bwt->first_leaf();
			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				sa_leaf L = S.top();
				S.pop();
				leaves++;

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				assert(L.rn.second > L.rn.first);

				for(uint64_t i = L.rn.first+1; i<L.rn.second; ++i){

					assert(LCP[i]==nil);

					LCP[i] = L.depth;

					lcp_values++;
					m++;

				}

				m++;

				assert(m<=n);

				int t = 0;

				bwt->next_leaves(L, TMP_LEAVES, t, 2);

				for(int i=t-1;i>=0;--i) S.push(TMP_LEAVES[i]);

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}
		}

		cout << "Visited leaves cover " << m << "/" << n << " input characters." << endl;
		cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;

		cout << "Max stack size = " << max_stack << endl;
		cout << "Processed " << leaves << " suffix-tree leaves of size >= 2." << endl;

		cout << "\nNow navigating suffix tree nodes to compute remaining LCP values." << endl;

		{

			auto TMP_NODES = vector<typename bwt_t::sa_node_t>(5);

			uint64_t nodes = 0;//visited ST nodes
			max_stack = 0;

			stack<typename bwt_t::sa_node_t> S;

			typename bwt_t::sa_node_t root = bwt->root();

			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				typename bwt_t::sa_node_t N = S.top();
				S.pop();
				nodes++;

				update_lcp<lcp_int_t>(N,LCP,lcp_values);

				int t = 0;

				bwt->next_nodes(N, TMP_NODES, t);

				for(int i=t-1;i>=0;--i){

					S.push(TMP_NODES[i]);

				}

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}

			cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;
			cout << "Max stack size = " << max_stack << endl;
			cout << "Processed " << nodes << " suffix-tree nodes." << endl;

		}


	}